

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<SDL_Renderer_*>::Matcher(Matcher<SDL_Renderer_*> *this,Snapshot *value)

{
  ComparisonBase<testing::internal::EqMatcher<SDL_Renderer_*>,_SDL_Renderer_*,_testing::internal::AnyEq>
  local_38;
  Matcher<SDL_Renderer_*> local_30;
  Snapshot *local_18;
  Snapshot *value_local;
  Matcher<SDL_Renderer_*> *this_local;
  
  local_18 = value;
  value_local = (Snapshot *)this;
  internal::MatcherBase<SDL_Renderer_*>::MatcherBase(&this->super_MatcherBase<SDL_Renderer_*>);
  (this->super_MatcherBase<SDL_Renderer_*>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_00506b60;
  local_38.rhs_ = (SDL_Renderer_conflict *)Eq<SDL_Renderer*>(local_18);
  Matcher<SDL_Renderer*>::Matcher<testing::internal::EqMatcher<SDL_Renderer*>,void>
            ((Matcher<SDL_Renderer*> *)&local_30,(EqMatcher<SDL_Renderer_*> *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }